

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode inflate_stream(connectdata *conn,SingleRequest *k)

{
  z_stream *pzVar1;
  uInt uVar2;
  Bytef *pBVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  CURLcode CVar7;
  Bytef *ptr;
  
  pzVar1 = &k->z;
  uVar2 = (k->z).avail_in;
  pBVar3 = (k->z).next_in;
  ptr = (Bytef *)(*Curl_cmalloc)(0x4000);
  if (ptr == (Bytef *)0x0) {
    inflateEnd(pzVar1);
    k->zlib_init = ZLIB_UNINIT;
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
  else {
    bVar4 = 1;
LAB_0012f142:
    do {
      (k->z).next_out = ptr;
      (k->z).avail_out = 0x4000;
      uVar5 = inflate(pzVar1,2);
      if (1 < uVar5) {
        if (!(bool)(~bVar4 & 1) && uVar5 == 0xfffffffd) {
          inflateEnd(pzVar1);
          iVar6 = inflateInit2_(pzVar1,0xfffffff1,"1.2.11",0x70);
          if (iVar6 == 0) {
            (k->z).next_in = pBVar3;
            (k->z).avail_in = uVar2;
            bVar4 = 0;
            goto LAB_0012f142;
          }
        }
        (*Curl_cfree)(ptr);
LAB_0012f248:
        process_zlib_error((connectdata *)conn->data,(z_stream *)(k->z).msg);
        inflateEnd(pzVar1);
        k->zlib_init = ZLIB_UNINIT;
        return CURLE_BAD_CONTENT_ENCODING;
      }
      iVar6 = (k->z).avail_out - 0x4000;
      if (((iVar6 != 0) && (k->ignorebody == false)) &&
         (CVar7 = Curl_client_write(conn,1,(char *)ptr,(ulong)(uint)-iVar6), CVar7 != CURLE_OK)) {
        (*Curl_cfree)(ptr);
        inflateEnd(pzVar1);
        k->zlib_init = ZLIB_UNINIT;
        return CVar7;
      }
      if (uVar5 == 1) {
        (*Curl_cfree)(ptr);
        iVar6 = inflateEnd(pzVar1);
        if (iVar6 == 0) {
          inflateEnd(pzVar1);
          k->zlib_init = ZLIB_UNINIT;
          return CURLE_OK;
        }
        goto LAB_0012f248;
      }
      bVar4 = 0;
      CVar7 = CURLE_OK;
    } while ((k->z).avail_in != 0);
    (*Curl_cfree)(ptr);
  }
  return CVar7;
}

Assistant:

static CURLcode
inflate_stream(struct connectdata *conn,
               struct SingleRequest *k)
{
  int allow_restart = 1;
  z_stream *z = &k->z;          /* zlib state structure */
  uInt nread = z->avail_in;
  Bytef *orig_in = z->next_in;
  int status;                   /* zlib status */
  CURLcode result = CURLE_OK;   /* Curl_client_write status */
  char *decomp;                 /* Put the decompressed data here. */

  /* Dynamically allocate a buffer for decompression because it's uncommonly
     large to hold on the stack */
  decomp = malloc(DSIZ);
  if(decomp == NULL) {
    return exit_zlib(z, &k->zlib_init, CURLE_OUT_OF_MEMORY);
  }

  /* because the buffer size is fixed, iteratively decompress and transfer to
     the client via client_write. */
  for(;;) {
    /* (re)set buffer for decompressed output for every iteration */
    z->next_out = (Bytef *)decomp;
    z->avail_out = DSIZ;

    status = inflate(z, Z_SYNC_FLUSH);
    if(status == Z_OK || status == Z_STREAM_END) {
      allow_restart = 0;
      if((DSIZ - z->avail_out) && (!k->ignorebody)) {
        result = Curl_client_write(conn, CLIENTWRITE_BODY, decomp,
                                   DSIZ - z->avail_out);
        /* if !CURLE_OK, clean up, return */
        if(result) {
          free(decomp);
          return exit_zlib(z, &k->zlib_init, result);
        }
      }

      /* Done? clean up, return */
      if(status == Z_STREAM_END) {
        free(decomp);
        if(inflateEnd(z) == Z_OK)
          return exit_zlib(z, &k->zlib_init, result);
        else
          return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
      }

      /* Done with these bytes, exit */

      /* status is always Z_OK at this point! */
      if(z->avail_in == 0) {
        free(decomp);
        return result;
      }
    }
    else if(allow_restart && status == Z_DATA_ERROR) {
      /* some servers seem to not generate zlib headers, so this is an attempt
         to fix and continue anyway */

      (void) inflateEnd(z);     /* don't care about the return code */
      if(inflateInit2(z, -MAX_WBITS) != Z_OK) {
        free(decomp);
        return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
      }
      z->next_in = orig_in;
      z->avail_in = nread;
      allow_restart = 0;
      continue;
    }
    else {                      /* Error; exit loop, handle below */
      free(decomp);
      return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
    }
  }
  /* Will never get here */
}